

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-fds.c
# Opt level: O1

int sanity_assert_no_wsi_traces(lws_context *context,lws *wsi)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  
  if ((context->field_0x7b8 & 4) != 0) {
    bVar3 = (ulong)context->max_fds == 0;
    if (!bVar3) {
      if (*context->lws_lookup != wsi) {
        lVar2 = 8;
        do {
          bVar3 = (ulong)context->max_fds << 3 == lVar2;
          if (bVar3) {
            return 0;
          }
          plVar1 = (long *)((long)context->lws_lookup + lVar2);
          lVar2 = lVar2 + 8;
        } while ((lws *)*plVar1 != wsi);
      }
      if (!bVar3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/plat/unix/unix-fds.c"
                      ,0x4b,
                      "int sanity_assert_no_wsi_traces(const struct lws_context *, struct lws *)");
      }
    }
  }
  return 0;
}

Assistant:

int
sanity_assert_no_wsi_traces(const struct lws_context *context, struct lws *wsi)
{
	struct lws **p, **done;

	if (!context->max_fds_unrelated_to_ulimit)
		/* can't tell */
		return 0;

	/* slow fds handling */

	p = context->lws_lookup;
	done = &p[context->max_fds];

	/* confirm the wsi doesn't already exist */

	while (p != done && *p != wsi)
		p++;

	if (p == done)
		return 0;

	assert(0); /* this wsi is still mentioned inside lws */

	return 1;
}